

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjExporter::WriteGeometryFile(ObjExporter *this,bool noMtl)

{
  string *psVar1;
  bool bVar2;
  pointer pvVar3;
  pointer paVar4;
  pointer pMVar5;
  pointer pFVar6;
  pointer pFVar7;
  ostream *poVar8;
  Face *f;
  pointer pMVar9;
  pointer pFVar10;
  undefined7 in_register_00000031;
  vertexData *v;
  pointer pvVar11;
  vertexData *v_1;
  pointer paVar12;
  pointer pFVar13;
  aiMatrix4x4 mBase;
  
  WriteHeader(this,&this->mOutput);
  if ((int)CONCAT71(in_register_00000031,noMtl) == 0) {
    poVar8 = std::operator<<((ostream *)this,"mtllib ");
    GetMaterialLibName_abi_cxx11_((string *)&mBase,this);
    poVar8 = std::operator<<(poVar8,(string *)&mBase);
    poVar8 = std::operator<<(poVar8,(string *)&this->endl);
    std::operator<<(poVar8,(string *)&this->endl);
    std::__cxx11::string::~string((string *)&mBase);
  }
  mBase.a1 = 1.0;
  mBase.a2 = 0.0;
  mBase.a3 = 0.0;
  mBase.a4 = 0.0;
  mBase.b1 = 0.0;
  mBase.b2 = 1.0;
  mBase.b3 = 0.0;
  mBase.b4 = 0.0;
  mBase.c1 = 0.0;
  mBase.c2 = 0.0;
  mBase.c3 = 1.0;
  mBase.c4 = 0.0;
  mBase.d1 = 0.0;
  mBase.d2 = 0.0;
  mBase.d3 = 0.0;
  mBase.d4 = 1.0;
  AddNode(this,this->pScene->mRootNode,&mBase);
  indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::getKeys
            (&this->mVpMap,&this->vp);
  bVar2 = this->useVc;
  poVar8 = std::operator<<((ostream *)this,"# ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  psVar1 = &this->endl;
  if (bVar2 == false) {
    poVar8 = std::operator<<(poVar8," vertex positions");
    std::operator<<(poVar8,(string *)psVar1);
    pvVar3 = (this->vp).
             super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar11 = (this->vp).
                   super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar3;
        pvVar11 = pvVar11 + 1) {
      poVar8 = std::operator<<((ostream *)this,"v  ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vp).x);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vp).y);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vp).z);
      std::operator<<(poVar8,(string *)psVar1);
    }
  }
  else {
    poVar8 = std::operator<<(poVar8," vertex positions and colors");
    std::operator<<(poVar8,(string *)psVar1);
    pvVar3 = (this->vp).
             super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar11 = (this->vp).
                   super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar3;
        pvVar11 = pvVar11 + 1) {
      poVar8 = std::operator<<((ostream *)this,"v  ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vp).x);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vp).y);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vp).z);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vc).r);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vc).g);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(pvVar11->vc).b);
      std::operator<<(poVar8,(string *)psVar1);
    }
  }
  std::operator<<((ostream *)this,(string *)psVar1);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
            (&this->mVtMap,&this->vt);
  poVar8 = std::operator<<((ostream *)this,"# ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," UV coordinates");
  std::operator<<(poVar8,(string *)psVar1);
  paVar4 = (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar12 = (this->vt).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start; paVar12 != paVar4; paVar12 = paVar12 + 1) {
    poVar8 = std::operator<<((ostream *)this,"vt ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paVar12->x);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paVar12->y);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paVar12->z);
    std::operator<<(poVar8,(string *)psVar1);
  }
  std::operator<<((ostream *)this,(string *)psVar1);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
            (&this->mVnMap,&this->vn);
  poVar8 = std::operator<<((ostream *)this,"# ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," vertex normals");
  std::operator<<(poVar8,(string *)psVar1);
  paVar4 = (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar12 = (this->vn).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start; paVar12 != paVar4; paVar12 = paVar12 + 1) {
    poVar8 = std::operator<<((ostream *)this,"vn ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paVar12->x);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paVar12->y);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paVar12->z);
    std::operator<<(poVar8,(string *)psVar1);
  }
  std::operator<<((ostream *)this,(string *)psVar1);
  pMVar5 = (this->mMeshes).
           super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar9 = (this->mMeshes).
                super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar9 != pMVar5; pMVar9 = pMVar9 + 1) {
    poVar8 = std::operator<<((ostream *)this,"# Mesh \'");
    poVar8 = std::operator<<(poVar8,(string *)pMVar9);
    poVar8 = std::operator<<(poVar8,"\' with ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," faces");
    std::operator<<(poVar8,(string *)psVar1);
    if ((pMVar9->name)._M_string_length != 0) {
      poVar8 = std::operator<<((ostream *)this,"g ");
      poVar8 = std::operator<<(poVar8,(string *)pMVar9);
      std::operator<<(poVar8,(string *)psVar1);
    }
    if (!noMtl) {
      poVar8 = std::operator<<((ostream *)this,"usemtl ");
      poVar8 = std::operator<<(poVar8,(string *)&pMVar9->matname);
      std::operator<<(poVar8,(string *)psVar1);
    }
    pFVar6 = (pMVar9->faces).
             super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar10 = (pMVar9->faces).
                   super__Vector_base<Assimp::ObjExporter::Face,_std::allocator<Assimp::ObjExporter::Face>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar10 != pFVar6;
        pFVar10 = pFVar10 + 1) {
      poVar8 = std::operator<<((ostream *)this,pFVar10->kind);
      std::operator<<(poVar8,' ');
      pFVar7 = (pFVar10->indices).
               super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pFVar13 = (pFVar10->indices).
                     super__Vector_base<Assimp::ObjExporter::FaceVertex,_std::allocator<Assimp::ObjExporter::FaceVertex>_>
                     ._M_impl.super__Vector_impl_data._M_start; pFVar13 != pFVar7;
          pFVar13 = pFVar13 + 1) {
        poVar8 = std::operator<<((ostream *)this,' ');
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        if (pFVar10->kind != 'p') {
          if ((pFVar10->kind == 'f') || (pFVar13->vt != 0)) {
            std::operator<<((ostream *)this,'/');
            if (pFVar13->vt != 0) {
              std::ostream::_M_insert<unsigned_long>((ulong)this);
            }
          }
          if ((pFVar10->kind == 'f') && (pFVar13->vn != 0)) {
            poVar8 = std::operator<<((ostream *)this,'/');
            std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          }
        }
      }
      std::operator<<((ostream *)this,(string *)psVar1);
    }
    std::operator<<((ostream *)this,(string *)psVar1);
  }
  return;
}

Assistant:

void ObjExporter::WriteGeometryFile(bool noMtl) {
    WriteHeader(mOutput);
    if (!noMtl)
        mOutput << "mtllib "  << GetMaterialLibName() << endl << endl;

    // collect mesh geometry
    aiMatrix4x4 mBase;
    AddNode(pScene->mRootNode, mBase);

    // write vertex positions with colors, if any
    mVpMap.getKeys( vp );
    if ( !useVc ) {
        mOutput << "# " << vp.size() << " vertex positions" << endl;
        for ( const vertexData& v : vp ) {
            mOutput << "v  " << v.vp.x << " " << v.vp.y << " " << v.vp.z << endl;
        }
    } else {
        mOutput << "# " << vp.size() << " vertex positions and colors" << endl;
        for ( const vertexData& v : vp ) {
            mOutput << "v  " << v.vp.x << " " << v.vp.y << " " << v.vp.z << " " << v.vc.r << " " << v.vc.g << " " << v.vc.b << endl;
        }
    }
    mOutput << endl;

    // write uv coordinates
    mVtMap.getKeys(vt);
    mOutput << "# " << vt.size() << " UV coordinates" << endl;
    for(const aiVector3D& v : vt) {
        mOutput << "vt " << v.x << " " << v.y << " " << v.z << endl;
    }
    mOutput << endl;

    // write vertex normals
    mVnMap.getKeys(vn);
    mOutput << "# " << vn.size() << " vertex normals" << endl;
    for(const aiVector3D& v : vn) {
        mOutput << "vn " << v.x << " " << v.y << " " << v.z << endl;
    }
    mOutput << endl;

    // now write all mesh instances
    for(const MeshInstance& m : mMeshes) {
        mOutput << "# Mesh \'" << m.name << "\' with " << m.faces.size() << " faces" << endl;
        if (!m.name.empty()) {
            mOutput << "g " << m.name << endl;
        }
        if ( !noMtl ) {
            mOutput << "usemtl " << m.matname << endl;
        }

        for(const Face& f : m.faces) {
            mOutput << f.kind << ' ';
            for(const FaceVertex& fv : f.indices) {
                mOutput << ' ' << fv.vp;

                if (f.kind != 'p') {
                    if (fv.vt || f.kind == 'f') {
                        mOutput << '/';
                    }
                    if (fv.vt) {
                        mOutput << fv.vt;
                    }
                    if (f.kind == 'f' && fv.vn) {
                        mOutput << '/' << fv.vn;
                    }
                }
            }

            mOutput << endl;
        }
        mOutput << endl;
    }
}